

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

int __thiscall tiger::trains::network::TCPSocket::init(TCPSocket *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  
  iVar2 = socket(2,1,0);
  this->pSocket = iVar2;
  bVar1 = isSocketValid(this);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool TCPSocket::init()
{
#if defined(linux) || defined(__linux) || defined(__linux__)

#else
    WSADATA ws;
    WSAStartup(MAKEWORD(2, 2), &ws);
#endif

    pSocket = socket(AF_INET, SOCK_STREAM, 0);

    return isSocketValid();
}